

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::ElementInstanceList::ParseInstanceList
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               Element *pcElement,ElementInstanceList *p_pcOut,PLYImporter *loader)

{
  ElementInstanceList *pcElement_00;
  bool bVar1;
  reference p_pcOut_00;
  reference local_88;
  undefined1 local_60 [8];
  ElementInstance elt;
  reference pvStack_40;
  uint i_1;
  char *pCur;
  PLYImporter *pPStack_30;
  uint i;
  PLYImporter *loader_local;
  ElementInstanceList *p_pcOut_local;
  Element *pcElement_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  pPStack_30 = loader;
  loader_local = (PLYImporter *)p_pcOut;
  p_pcOut_local = (ElementInstanceList *)pcElement;
  pcElement_local = (Element *)buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)streamBuffer;
  if (pcElement != (Element *)0x0) {
    if ((pcElement->eSemantic == EEST_INVALID) ||
       (bVar1 = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::empty
                          (&pcElement->alProperties), bVar1)) {
      for (pCur._4_4_ = 0;
          pCur._4_4_ <
          *(uint *)&p_pcOut_local[2].alInstances.
                    super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage; pCur._4_4_ = pCur._4_4_ + 1)
      {
        DOM::SkipComments((vector<char,_std::allocator<char>_> *)pcElement_local);
        DOM::SkipLine((vector<char,_std::allocator<char>_> *)pcElement_local);
        IOStreamBuffer<char>::getNextLine
                  ((IOStreamBuffer<char> *)buffer_local,
                   (vector<char,_std::allocator<char>_> *)pcElement_local);
      }
    }
    else {
      pvStack_40 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)pcElement_local,0);
      for (elt.alProperties.
           super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          pcElement_00 = p_pcOut_local,
          elt.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
          *(uint *)&p_pcOut_local[2].alInstances.
                    super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          elt.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               elt.alProperties.
               super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        if (loader_local == (PLYImporter *)0x0) {
          ElementInstance::ElementInstance((ElementInstance *)local_60);
          ElementInstance::ParseInstance
                    (&stack0xffffffffffffffc0,(Element *)p_pcOut_local,(ElementInstance *)local_60);
          if (*(int *)&p_pcOut_local[1].alInstances.
                       super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0) {
            PLYImporter::LoadVertex
                      (pPStack_30,(Element *)p_pcOut_local,(ElementInstance *)local_60,
                       elt.alProperties.
                       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          else if (*(int *)&p_pcOut_local[1].alInstances.
                            super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                            ._M_impl.super__Vector_impl_data._M_start == 1) {
            PLYImporter::LoadFace
                      (pPStack_30,(Element *)p_pcOut_local,(ElementInstance *)local_60,
                       elt.alProperties.
                       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          else if (*(int *)&p_pcOut_local[1].alInstances.
                            super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                            ._M_impl.super__Vector_impl_data._M_start == 2) {
            PLYImporter::LoadFace
                      (pPStack_30,(Element *)p_pcOut_local,(ElementInstance *)local_60,
                       elt.alProperties.
                       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          ElementInstance::~ElementInstance((ElementInstance *)local_60);
        }
        else {
          p_pcOut_00 = std::
                       vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                       ::operator[]((vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                                     *)loader_local,
                                    (ulong)elt.alProperties.
                                           super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
          ;
          ElementInstance::ParseInstance
                    (&stack0xffffffffffffffc0,(Element *)pcElement_00,p_pcOut_00);
        }
        IOStreamBuffer<char>::getNextLine
                  ((IOStreamBuffer<char> *)buffer_local,
                   (vector<char,_std::allocator<char>_> *)pcElement_local);
        bVar1 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)pcElement_local);
        if (bVar1) {
          local_88 = (reference)0x0;
        }
        else {
          local_88 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)pcElement_local,0);
        }
        pvStack_40 = local_88;
      }
    }
    return true;
  }
  __assert_fail("__null != pcElement",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x2a2,
                "static bool Assimp::PLY::ElementInstanceList::ParseInstanceList(IOStreamBuffer<char> &, std::vector<char> &, const PLY::Element *, PLY::ElementInstanceList *, PLYImporter *)"
               );
}

Assistant:

bool PLY::ElementInstanceList::ParseInstanceList(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const PLY::Element* pcElement,
  PLY::ElementInstanceList* p_pcOut,
  PLYImporter* loader)
{
  ai_assert(NULL != pcElement);

  // parse all elements
  if (EEST_INVALID == pcElement->eSemantic || pcElement->alProperties.empty())
  {
    // if the element has an unknown semantic we can skip all lines
    // However, there could be comments
    for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
    {
      PLY::DOM::SkipComments(buffer);
      PLY::DOM::SkipLine(buffer);
      streamBuffer.getNextLine(buffer);
    }
  }
  else
  {
    const char* pCur = (const char*)&buffer[0];
    // be sure to have enough storage
    for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
    {
      if (p_pcOut)
        PLY::ElementInstance::ParseInstance(pCur, pcElement, &p_pcOut->alInstances[i]);
      else
      {
        ElementInstance elt;
        PLY::ElementInstance::ParseInstance(pCur, pcElement, &elt);

        // Create vertex or face
        if (pcElement->eSemantic == EEST_Vertex)
        {
          //call loader instance from here
          loader->LoadVertex(pcElement, &elt, i);
        }
        else if (pcElement->eSemantic == EEST_Face)
        {
          //call loader instance from here
          loader->LoadFace(pcElement, &elt, i);
        }
        else if (pcElement->eSemantic == EEST_TriStrip)
        {
          //call loader instance from here
          loader->LoadFace(pcElement, &elt, i);
        }
      }

      streamBuffer.getNextLine(buffer);
      pCur = (buffer.empty()) ? NULL : (const char*)&buffer[0];
    }
  }
  return true;
}